

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O1

void remove_pending_message_by_index(MESSAGE_SENDER_HANDLE message_sender,size_t index)

{
  ASYNC_OPERATION_HANDLE pAVar1;
  MESSAGE_HANDLE message;
  ulong uVar2;
  ASYNC_OPERATION_HANDLE *ppAVar3;
  
  pAVar1 = message_sender->messages[index];
  message = (MESSAGE_HANDLE)pAVar1[1].async_operation_cancel_handler;
  if (message != (MESSAGE_HANDLE)0x0) {
    message_destroy(message);
    pAVar1[1].async_operation_cancel_handler = (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0;
  }
  async_operation_destroy(message_sender->messages[index]);
  uVar2 = message_sender->message_count - index;
  if (1 < uVar2) {
    memmove(message_sender->messages + index,message_sender->messages + index + 1,uVar2 * 8 - 8);
  }
  uVar2 = message_sender->message_count - 1;
  message_sender->message_count = uVar2;
  if (uVar2 == 0) {
    free(message_sender->messages);
    ppAVar3 = (ASYNC_OPERATION_HANDLE *)0x0;
  }
  else {
    if (uVar2 >> 0x3d != 0) {
      return;
    }
    ppAVar3 = (ASYNC_OPERATION_HANDLE *)realloc(message_sender->messages,uVar2 * 8);
    if (ppAVar3 == (ASYNC_OPERATION_HANDLE *)0x0) {
      return;
    }
  }
  message_sender->messages = ppAVar3;
  return;
}

Assistant:

static void remove_pending_message_by_index(MESSAGE_SENDER_HANDLE message_sender, size_t index)
{
    ASYNC_OPERATION_HANDLE* new_messages;
    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, message_sender->messages[index]);

    if (message_with_callback->message != NULL)
    {
        message_destroy(message_with_callback->message);
        message_with_callback->message = NULL;
    }

    async_operation_destroy(message_sender->messages[index]);

    if (message_sender->message_count - index > 1)
    {
        (void)memmove(&message_sender->messages[index], &message_sender->messages[index + 1], sizeof(ASYNC_OPERATION_HANDLE) * (message_sender->message_count - index - 1));
    }

    message_sender->message_count--;

    if (message_sender->message_count > 0)
    {
        size_t realloc_size = safe_multiply_size_t(sizeof(ASYNC_OPERATION_HANDLE), (message_sender->message_count));
        if (realloc_size != SIZE_MAX &&
            (new_messages = (ASYNC_OPERATION_HANDLE*)realloc(message_sender->messages, realloc_size)) != NULL)
        {
            message_sender->messages = new_messages;
        }
    }
    else
    {
        free(message_sender->messages);
        message_sender->messages = NULL;
    }
}